

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O0

int32_t __thiscall
icu_63::SimpleDateFormat::matchQuarterString
          (SimpleDateFormat *this,UnicodeString *text,int32_t start,UCalendarDateFields field,
          UnicodeString *data,int32_t dataCount,Calendar *cal)

{
  int32_t iVar1;
  undefined1 local_88 [4];
  int32_t matchLength;
  UnicodeString bestMatchName;
  int local_40;
  int32_t bestMatch;
  int32_t bestMatchLength;
  int32_t count;
  int32_t i;
  int32_t dataCount_local;
  UnicodeString *data_local;
  UCalendarDateFields field_local;
  int32_t start_local;
  UnicodeString *text_local;
  SimpleDateFormat *this_local;
  
  bestMatchLength = 0;
  local_40 = 0;
  bestMatchName.fUnion._52_4_ = 0xffffffff;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_88);
  for (; bestMatchLength < dataCount; bestMatchLength = bestMatchLength + 1) {
    iVar1 = matchStringWithOptionalDot(text,start,data + bestMatchLength);
    if (local_40 < iVar1) {
      bestMatchName.fUnion._52_4_ = bestMatchLength;
      local_40 = iVar1;
    }
  }
  if ((int)bestMatchName.fUnion._52_4_ < 0) {
    this_local._4_4_ = -start;
  }
  else {
    Calendar::set(cal,field,bestMatchName.fUnion._52_4_ * 3);
    this_local._4_4_ = start + local_40;
  }
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_88);
  return this_local._4_4_;
}

Assistant:

int32_t SimpleDateFormat::matchQuarterString(const UnicodeString& text,
                              int32_t start,
                              UCalendarDateFields field,
                              const UnicodeString* data,
                              int32_t dataCount,
                              Calendar& cal) const
{
    int32_t i = 0;
    int32_t count = dataCount;

    // There may be multiple strings in the data[] array which begin with
    // the same prefix (e.g., Cerven and Cervenec (June and July) in Czech).
    // We keep track of the longest match, and return that.  Note that this
    // unfortunately requires us to test all array elements.
    int32_t bestMatchLength = 0, bestMatch = -1;
    UnicodeString bestMatchName;

    for (; i < count; ++i) {
        int32_t matchLength = 0;
        if ((matchLength = matchStringWithOptionalDot(text, start, data[i])) > bestMatchLength) {
            bestMatchLength = matchLength;
            bestMatch = i;
        }
    }

    if (bestMatch >= 0) {
        cal.set(field, bestMatch * 3);
        return start + bestMatchLength;
    }

    return -start;
}